

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# psf_file.cpp
# Opt level: O1

void __thiscall PSFFile::PSFFile(PSFFile *this,string *filename)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  size_t __n;
  uint8_t uVar2;
  bool bVar3;
  int iVar4;
  ulong uVar5;
  long lVar6;
  ulong uVar7;
  iterator iVar8;
  ostream *poVar9;
  runtime_error *prVar10;
  ulong uVar11;
  ulong uVar12;
  ulong uVar13;
  ulong uVar14;
  ulong uVar15;
  ulong uVar16;
  uint32_t compressed_exe_size;
  uint32_t reserved_size;
  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  tags;
  string tag_string;
  uint32_t compressed_exe_crc32;
  string key;
  string value;
  string tag_marker;
  string signature;
  string tag_line;
  ostringstream message_buffer;
  ifstream in;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_518;
  uint local_510;
  uint local_50c;
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  local_508;
  long *local_4d0;
  ulong local_4c8;
  long local_4c0 [2];
  string *local_4b0;
  string *local_4a8;
  uint32_t local_49c;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_498;
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  *local_490;
  key_type local_488;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_468;
  long *local_448 [2];
  long local_438 [2];
  long *local_428 [2];
  long local_418 [2];
  long *local_408 [2];
  long local_3f8 [2];
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_3e8 [5];
  stat local_270 [3];
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  local_68;
  
  this->_vptr_PSFFile = (_func_int **)&PTR__PSFFile_0010cd08;
  local_4a8 = &this->reserved_;
  paVar1 = &(this->reserved_).field_2;
  (this->reserved_)._M_dataplus._M_p = (pointer)paVar1;
  (this->reserved_)._M_string_length = 0;
  (this->reserved_).field_2._M_local_buf[0] = '\0';
  local_4b0 = &this->compressed_exe_;
  local_498 = &(this->compressed_exe_).field_2;
  (this->compressed_exe_)._M_dataplus._M_p = (pointer)local_498;
  (this->compressed_exe_)._M_string_length = 0;
  (this->compressed_exe_).field_2._M_local_buf[0] = '\0';
  (this->tags_)._M_h._M_buckets = &(this->tags_)._M_h._M_single_bucket;
  (this->tags_)._M_h._M_bucket_count = 1;
  (this->tags_)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->tags_)._M_h._M_element_count = 0;
  (this->tags_)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->tags_)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->tags_)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  iVar4 = stat((filename->_M_dataplus)._M_p,local_270);
  local_490 = &(this->tags_)._M_h;
  if ((iVar4 != 0) || (local_270[0].st_size == 0xffffffffffffffff)) {
    local_518 = paVar1;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_270);
    poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)local_270,(filename->_M_dataplus)._M_p,filename->_M_string_length
                       );
    std::__ostream_insert<char,std::char_traits<char>>(poVar9,": ",2);
    std::__ostream_insert<char,std::char_traits<char>>(poVar9,"File not exists.",0x10);
    prVar10 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::stringbuf::str();
    std::runtime_error::runtime_error(prVar10,(string *)local_3e8);
    __cxa_throw(prVar10,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  std::ifstream::ifstream(local_270);
  lVar6 = *(long *)(local_270[0].st_dev - 0x18);
  *(undefined4 *)((long)local_270[0].__unused + lVar6 + -0x5c) = 1;
  std::ios::clear((int)&local_518 + (int)lVar6 + 0x2a8);
  std::ifstream::open((string *)local_270,(_Ios_Openmode)filename);
  local_428[0] = local_418;
  std::__cxx11::string::_M_construct((ulong)local_428,'\x03');
  std::istream::read((char *)local_270,(long)local_428[0]);
  if (local_270[0].st_ino != 3) {
    local_518 = paVar1;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_3e8);
    poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)local_3e8,(filename->_M_dataplus)._M_p,filename->_M_string_length
                       );
    std::__ostream_insert<char,std::char_traits<char>>(poVar9,": ",2);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar9,"Unable to read the PSF signature.",0x21);
    prVar10 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::stringbuf::str();
    std::runtime_error::runtime_error(prVar10,(string *)&local_508);
    __cxa_throw(prVar10,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  iVar4 = std::__cxx11::string::compare((char *)local_428);
  if (iVar4 != 0) {
    local_518 = paVar1;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_3e8);
    poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)local_3e8,(filename->_M_dataplus)._M_p,filename->_M_string_length
                       );
    std::__ostream_insert<char,std::char_traits<char>>(poVar9,": ",2);
    std::__ostream_insert<char,std::char_traits<char>>(poVar9,"Invalid PSF signature. ",0x17);
    prVar10 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::stringbuf::str();
    std::runtime_error::runtime_error(prVar10,(string *)&local_508);
    __cxa_throw(prVar10,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  std::istream::read((char *)local_270,(long)local_3e8);
  uVar2 = (uint8_t)local_3e8[0].first._M_dataplus._M_p;
  if (local_270[0].st_ino != 1) {
    local_518 = paVar1;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_3e8);
    poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)local_3e8,(filename->_M_dataplus)._M_p,filename->_M_string_length
                       );
    std::__ostream_insert<char,std::char_traits<char>>(poVar9,": ",2);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar9,"Unable to read the version byte.",0x20);
    prVar10 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::stringbuf::str();
    std::runtime_error::runtime_error(prVar10,(string *)&local_508);
    __cxa_throw(prVar10,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  bVar3 = ReadStreamAsInt32L<std::ifstream,unsigned_int>
                    ((basic_ifstream<char,_std::char_traits<char>_> *)local_270,&local_50c);
  if (!bVar3) {
    local_518 = paVar1;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_3e8);
    poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)local_3e8,(filename->_M_dataplus)._M_p,filename->_M_string_length
                       );
    std::__ostream_insert<char,std::char_traits<char>>(poVar9,": ",2);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar9,"Unable to read the size of reserved area.",0x29);
    prVar10 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::stringbuf::str();
    std::runtime_error::runtime_error(prVar10,(string *)&local_508);
    __cxa_throw(prVar10,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  bVar3 = ReadStreamAsInt32L<std::ifstream,unsigned_int>
                    ((basic_ifstream<char,_std::char_traits<char>_> *)local_270,&local_510);
  if (!bVar3) {
    local_518 = paVar1;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_3e8);
    poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)local_3e8,(filename->_M_dataplus)._M_p,filename->_M_string_length
                       );
    std::__ostream_insert<char,std::char_traits<char>>(poVar9,": ",2);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar9,"Unable to read the size of compressed program.",0x2e);
    prVar10 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::stringbuf::str();
    std::runtime_error::runtime_error(prVar10,(string *)&local_508);
    __cxa_throw(prVar10,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  bVar3 = ReadStreamAsInt32L<std::ifstream,unsigned_int>
                    ((basic_ifstream<char,_std::char_traits<char>_> *)local_270,&local_49c);
  if (!bVar3) {
    local_518 = paVar1;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_3e8);
    poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)local_3e8,(filename->_M_dataplus)._M_p,filename->_M_string_length
                       );
    std::__ostream_insert<char,std::char_traits<char>>(poVar9,": ",2);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar9,"Unable to read the CRC32 of compressed program.",0x2f);
    prVar10 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::stringbuf::str();
    std::runtime_error::runtime_error(prVar10,(string *)&local_508);
    __cxa_throw(prVar10,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  uVar14 = (ulong)(local_50c + local_510 + 0x10);
  if ((ulong)local_270[0].st_size < uVar14) {
    local_518 = paVar1;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_3e8);
    poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)local_3e8,(filename->_M_dataplus)._M_p,filename->_M_string_length
                       );
    std::__ostream_insert<char,std::char_traits<char>>(poVar9,": ",2);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar9,"File is too short than expected.",0x20);
    prVar10 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::stringbuf::str();
    std::runtime_error::runtime_error(prVar10,(string *)&local_508);
    __cxa_throw(prVar10,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  this->version_ = uVar2;
  std::__cxx11::string::resize((ulong)local_4a8,(char)local_50c);
  std::istream::read((char *)local_270,(long)(local_4a8->_M_dataplus)._M_p);
  if (local_270[0].st_ino != local_50c) {
    local_518 = paVar1;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_3e8);
    poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)local_3e8,(filename->_M_dataplus)._M_p,filename->_M_string_length
                       );
    std::__ostream_insert<char,std::char_traits<char>>(poVar9,": ",2);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar9,"Unable to read the reserved area.",0x21);
    prVar10 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::stringbuf::str();
    std::runtime_error::runtime_error(prVar10,(string *)&local_508);
    __cxa_throw(prVar10,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  std::__cxx11::string::resize((ulong)local_4b0,(char)local_510);
  std::istream::read((char *)local_270,(long)(local_4b0->_M_dataplus)._M_p);
  if (local_270[0].st_ino != local_510) {
    local_518 = paVar1;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_3e8);
    poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)local_3e8,(filename->_M_dataplus)._M_p,filename->_M_string_length
                       );
    std::__ostream_insert<char,std::char_traits<char>>(poVar9,": ",2);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar9,"Unable to read the compressed program.",0x26);
    prVar10 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::stringbuf::str();
    std::runtime_error::runtime_error(prVar10,(string *)&local_508);
    __cxa_throw(prVar10,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  this->compressed_exe_crc32_ = local_49c;
  if (uVar14 + 5 <= (ulong)local_270[0].st_size) {
    local_448[0] = local_438;
    std::__cxx11::string::_M_construct((ulong)local_448,'\x05');
    std::istream::read((char *)local_270,(long)local_448[0]);
    if ((local_270[0].st_ino == 5) &&
       (iVar4 = std::__cxx11::string::compare((char *)local_448), iVar4 == 0)) {
      uVar14 = local_270[0].st_size - (ulong)(local_50c + local_510 + 0x15);
      local_4d0 = local_4c0;
      local_518 = paVar1;
      std::__cxx11::string::_M_construct((ulong)&local_4d0,(char)uVar14);
      std::istream::read((char *)local_270,(long)local_4d0);
      if (local_270[0].st_ino != uVar14) {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)local_3e8);
        poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                           ((ostream *)local_3e8,(filename->_M_dataplus)._M_p,
                            filename->_M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>(poVar9,": ",2);
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar9,"Unable to read the tag area.",0x1c);
        prVar10 = (runtime_error *)__cxa_allocate_exception(0x10);
        std::__cxx11::stringbuf::str();
        std::runtime_error::runtime_error(prVar10,(string *)&local_508);
        __cxa_throw(prVar10,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
      }
      local_508._M_buckets = &local_508._M_single_bucket;
      local_508._M_bucket_count = 1;
      local_508._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
      local_508._M_element_count = 0;
      local_508._M_rehash_policy._M_max_load_factor = 1.0;
      local_508._M_rehash_policy._M_next_resize = 0;
      local_508._M_single_bucket = (__node_base_ptr)0x0;
      if (local_4c8 != 0) {
        uVar14 = 0;
        do {
          uVar5 = std::__cxx11::string::find((char *)&local_4d0,0x10a447,uVar14);
          if (uVar5 == 0xffffffffffffffff) {
            uVar5 = local_4c8;
          }
          std::__cxx11::string::substr((ulong)local_408,(ulong)&local_4d0);
          lVar6 = std::__cxx11::string::find((char *)local_408,0x10a144,0);
          if (lVar6 != -1) {
            uVar16 = lVar6 + uVar14 + 1;
            uVar7 = lVar6 + uVar14;
            uVar11 = uVar7;
            if (uVar14 < uVar7) {
              uVar11 = uVar14;
            }
            do {
              uVar15 = uVar7;
              uVar12 = uVar11;
              if (uVar15 <= uVar14) break;
              uVar7 = uVar15 - 1;
              uVar12 = uVar15;
            } while (*(byte *)((long)local_4d0 + (uVar15 - 1)) < 0x21);
            uVar7 = uVar5;
            uVar11 = uVar16;
            if (uVar5 < uVar16) {
              uVar11 = uVar5;
            }
            do {
              uVar13 = uVar7;
              uVar15 = uVar11;
              if (uVar13 <= uVar16) break;
              uVar7 = uVar13 - 1;
              uVar15 = uVar13;
            } while (*(byte *)((long)local_4d0 + (uVar13 - 1)) < 0x21);
            if (uVar14 < uVar12) {
              do {
                if (0x20 < *(byte *)((long)local_4d0 + uVar14)) break;
                uVar14 = uVar14 + 1;
              } while (uVar12 != uVar14);
            }
            for (; (uVar16 < uVar15 && (*(byte *)((long)local_4d0 + uVar16) < 0x21));
                uVar16 = uVar16 + 1) {
            }
            std::__cxx11::string::substr((ulong)&local_488,(ulong)&local_4d0);
            std::__cxx11::string::substr((ulong)&local_468,(ulong)&local_4d0);
            iVar8 = std::
                    _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                    ::find(&local_508,&local_488);
            if (((iVar8.
                  super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true>
                  ._M_cur == (__node_type *)0x0) ||
                (__n = *(size_t *)
                        ((long)iVar8.
                               super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true>
                               ._M_cur + 0x10), __n != local_488._M_string_length)) ||
               ((__n != 0 &&
                (iVar4 = bcmp(*(void **)((long)iVar8.
                                               super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true>
                                               ._M_cur + 8),local_488._M_dataplus._M_p,__n),
                iVar4 != 0)))) {
              std::
              pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              ::
              pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_true>
                        (local_3e8,&local_488,&local_468);
              std::
              _Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
              ::_M_emplace<std::pair<std::__cxx11::string,std::__cxx11::string>>
                        ((_Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
                          *)&local_508,local_3e8);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_3e8[0].second._M_dataplus._M_p != &local_3e8[0].second.field_2) {
                operator_delete(local_3e8[0].second._M_dataplus._M_p,
                                local_3e8[0].second.field_2._M_allocated_capacity + 1);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)CONCAT71(local_3e8[0].first._M_dataplus._M_p._1_7_,
                              (uint8_t)local_3e8[0].first._M_dataplus._M_p) !=
                  &local_3e8[0].first.field_2) {
                operator_delete((undefined1 *)
                                CONCAT71(local_3e8[0].first._M_dataplus._M_p._1_7_,
                                         (uint8_t)local_3e8[0].first._M_dataplus._M_p),
                                local_3e8[0].first.field_2._M_allocated_capacity + 1);
              }
            }
            else {
              std::__cxx11::string::append
                        ((char *)((long)iVar8.
                                        super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true>
                                        ._M_cur + 0x28));
              std::__cxx11::string::_M_append
                        ((char *)((long)iVar8.
                                        super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true>
                                        ._M_cur + 0x28),(ulong)local_468._M_dataplus._M_p);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_468._M_dataplus._M_p != &local_468.field_2) {
              operator_delete(local_468._M_dataplus._M_p,local_468.field_2._M_allocated_capacity + 1
                             );
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_488._M_dataplus._M_p != &local_488.field_2) {
              operator_delete(local_488._M_dataplus._M_p,local_488.field_2._M_allocated_capacity + 1
                             );
            }
          }
          if (local_408[0] != local_3f8) {
            operator_delete(local_408[0],local_3f8[0] + 1);
          }
          uVar14 = uVar5 + 1;
        } while (uVar14 < local_4c8);
      }
      std::
      _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
      ::_Hashtable(&local_68,&local_508);
      std::
      _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
      ::_M_move_assign(local_490,&local_68);
      std::
      _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
      ::~_Hashtable(&local_68);
      std::
      _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
      ::~_Hashtable(&local_508);
      if (local_4d0 != local_4c0) {
        operator_delete(local_4d0,local_4c0[0] + 1);
      }
    }
    if (local_448[0] != local_438) {
      operator_delete(local_448[0],local_438[0] + 1);
    }
  }
  if (local_428[0] != local_418) {
    operator_delete(local_428[0],local_418[0] + 1);
  }
  std::ifstream::~ifstream(local_270);
  return;
}

Assistant:

PSFFile::PSFFile(const std::string & filename) {
  // get input file size
  off_t filesize = path_getfilesize(filename.c_str());
  if (filesize == -1) {
    std::ostringstream message_buffer;
    message_buffer << filename << ": " << "File not exists.";
    throw std::runtime_error(message_buffer.str());
  }
  std::uintmax_t psf_size = static_cast<std::uintmax_t>(filesize);

  // open input file
  std::ifstream in;
  in.exceptions(std::ios::badbit);
  in.open(filename, std::ios::binary);

  // check signature
  std::string signature(kPSFSignatureSize, 0);
  in.read(&signature[0], kPSFSignatureSize);
  if (in.gcount() != kPSFSignatureSize) {
    std::ostringstream message_buffer;
    message_buffer << filename << ": " << "Unable to read the PSF signature.";
    throw std::runtime_error(message_buffer.str());
  }
  if (signature != kPSFSignature) {
    std::ostringstream message_buffer;
    message_buffer << filename << ": " << "Invalid PSF signature. ";
    throw std::runtime_error(message_buffer.str());
  }

  // read the version byte
  uint8_t version;
  if (!ReadStreamAsInt8(in, version)) {
    std::ostringstream message_buffer;
    message_buffer << filename << ": " << "Unable to read the version byte.";
    throw std::runtime_error(message_buffer.str());
  }

  // read the size of reserved area
  uint32_t reserved_size;
  if (!ReadStreamAsInt32L(in, reserved_size)) {
    std::ostringstream message_buffer;
    message_buffer << filename << ": " << "Unable to read the size of reserved area.";
    throw std::runtime_error(message_buffer.str());
  }

  // read the size of compressed program
  uint32_t compressed_exe_size;
  if (!ReadStreamAsInt32L(in, compressed_exe_size)) {
    std::ostringstream message_buffer;
    message_buffer << filename << ": " << "Unable to read the size of compressed program.";
    throw std::runtime_error(message_buffer.str());
  }

  // crc32 of compressed program
  uint32_t compressed_exe_crc32;
  if (!ReadStreamAsInt32L(in, compressed_exe_crc32)) {
    std::ostringstream message_buffer;
    message_buffer << filename << ": " << "Unable to read the CRC32 of compressed program.";
    throw std::runtime_error(message_buffer.str());
  }

  // check the size consistency
  size_t psf_mandatory_size = 0x10 + reserved_size + compressed_exe_size;
  if (psf_mandatory_size > psf_size) {
    std::ostringstream message_buffer;
    message_buffer << filename << ": " << "File is too short than expected.";
    throw std::runtime_error(message_buffer.str());
  }

  // set the version byte
  set_version(version);

  // read the reserved area
  reserved().resize(reserved_size);
  in.read(&reserved()[0], reserved_size);
  if (in.gcount() != reserved_size) {
    std::ostringstream message_buffer;
    message_buffer << filename << ": " << "Unable to read the reserved area.";
    throw std::runtime_error(message_buffer.str());
  }

  // read the compressed program
  compressed_exe().resize(compressed_exe_size);
  in.read(&compressed_exe()[0], compressed_exe_size);
  if (in.gcount() != compressed_exe_size) {
    std::ostringstream message_buffer;
    message_buffer << filename << ": " << "Unable to read the compressed program.";
    throw std::runtime_error(message_buffer.str());
  }

  // set the CRC32 of the compressed program
  set_compressed_exe_crc32(compressed_exe_crc32);

  // check the tag marker (optional area)
  if (psf_mandatory_size + kPSFTagMarkerSize <= psf_size) {
    std::string tag_marker(kPSFTagMarkerSize, 0);
    in.read(&tag_marker[0], kPSFTagMarkerSize);
    if (in.gcount() == kPSFTagMarkerSize && tag_marker == kPSFTagMarker) {
      // read entire of the tag area
      size_t tag_size = (size_t)psf_size - (0x10 + reserved_size + compressed_exe_size + kPSFTagMarkerSize);
      std::string tag_string(tag_size, 0);
      in.read(&tag_string[0], tag_size);
      if (in.gcount() != tag_size) {
        std::ostringstream message_buffer;
        message_buffer << filename << ": " << "Unable to read the tag area.";
        throw std::runtime_error(message_buffer.str());
      }

      // Parse tag section. Details are available here:
      // http://wiki.neillcorlett.com/PSFTagFormat
      std::unordered_map<std::string, std::string> tags;
      size_t tag_start_offset = 0;
      while (tag_start_offset < tag_string.size()) {
        // Search the end position of the current line.
        size_t tag_end_offset = tag_string.find("\n", tag_start_offset);
        if (tag_end_offset == std::string::npos) {
          // Tag section must end with a newline.
          // Read the all remaining bytes if a newline lacks though.
          tag_end_offset = tag_string.size();
        }

        // Search the variable=value separator.
        std::string tag_line = tag_string.substr(tag_start_offset, tag_end_offset - tag_start_offset);
        size_t tag_separator_offset = tag_line.find("=", 0);
        if (tag_separator_offset == std::string::npos) {
          // Blank lines, or lines not of the form "variable=value", are ignored.
          tag_start_offset = tag_end_offset + 1;
          continue;
        }
        tag_separator_offset += tag_start_offset;

        // Determine the start/end position of variable.
        size_t name_start_offset = tag_start_offset;
        size_t name_end_offset = tag_separator_offset;
        size_t value_start_offset = tag_separator_offset + 1;
        size_t value_end_offset = tag_end_offset;

        // Whitespace at the beginning/end of the line and before/after the = are ignored.
        // All characters 0x01-0x20 are considered whitespace.
        // (There must be no null (0x00) characters.)
        // Trim them.
        while (name_end_offset > name_start_offset && static_cast<unsigned char>(tag_string[name_end_offset - 1]) <= 0x20) {
          name_end_offset--;
        }
        while (value_end_offset > value_start_offset && static_cast<unsigned char>(tag_string[value_end_offset - 1]) <= 0x20) {
          value_end_offset--;
        }
        while (name_start_offset < name_end_offset && static_cast<unsigned char>(tag_string[name_start_offset]) <= 0x20) {
          name_start_offset++;
        }
        while (value_start_offset < value_end_offset && static_cast<unsigned char>(tag_string[value_start_offset]) <= 0x20) {
          value_start_offset++;
        }

        // Read variable=value as string.
        std::string key = tag_string.substr(name_start_offset, name_end_offset - name_start_offset);
        std::string value = tag_string.substr(value_start_offset, value_end_offset - value_start_offset);

        // Multiple-line variables must appear as consecutive lines using the same variable name.
        // For instance:
        //   comment=This is a
        //   comment=multiple-line
        //   comment=comment.
        // Therefore, check if the variable had already appeared.
        std::unordered_map<std::string, std::string>::iterator it = tags.find(key);
        if (it != tags.end() && it->first == key) {
          it->second += "\n";
          it->second += value;
        }
        else {
          tags.insert(it, std::make_pair(key, value));
        }

        // parse next line
        tag_start_offset = tag_end_offset + 1;
      }

      set_tags(std::move(tags));
    }
  }
}